

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

void __thiscall cmState::Directory::ComputeRelativePathTopSource(Directory *this)

{
  undefined8 *puVar1;
  bool bVar2;
  PointerType pSVar3;
  PointerType pBVar4;
  Snapshot *pSVar5;
  vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> snapshots;
  Snapshot snapshot;
  string currentSource;
  string result;
  allocator local_d9;
  undefined8 *local_d8;
  iterator iStack_d0;
  Snapshot *local_c8;
  Snapshot local_b8;
  Directory *local_a0;
  string local_98;
  string local_78;
  Snapshot local_58;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_40;
  PositionType local_38;
  
  local_b8.Position.Position = (this->Snapshot_).Position.Position;
  local_b8.State = (this->Snapshot_).State;
  local_b8.Position.Tree = (this->Snapshot_).Position.Tree;
  local_d8 = (undefined8 *)0x0;
  iStack_d0._M_current = (Snapshot *)0x0;
  local_c8 = (Snapshot *)0x0;
  std::vector<cmState::Snapshot,std::allocator<cmState::Snapshot>>::
  _M_realloc_insert<cmState::Snapshot_const&>
            ((vector<cmState::Snapshot,std::allocator<cmState::Snapshot>> *)&local_d8,(iterator)0x0,
             &local_b8);
  while( true ) {
    Snapshot::GetBuildsystemDirectoryParent(&local_58,&local_b8);
    local_b8.Position.Position = local_58.Position.Position;
    local_b8.State = local_58.State;
    local_b8.Position.Tree = local_58.Position.Tree;
    bVar2 = Snapshot::IsValid(&local_b8);
    puVar1 = local_d8;
    if (!bVar2) break;
    if (iStack_d0._M_current == local_c8) {
      std::vector<cmState::Snapshot,std::allocator<cmState::Snapshot>>::
      _M_realloc_insert<cmState::Snapshot_const&>
                ((vector<cmState::Snapshot,std::allocator<cmState::Snapshot>> *)&local_d8,iStack_d0,
                 &local_b8);
    }
    else {
      ((iStack_d0._M_current)->Position).Position = local_b8.Position.Position;
      (iStack_d0._M_current)->State = local_b8.State;
      ((iStack_d0._M_current)->Position).Tree = local_b8.Position.Tree;
      iStack_d0._M_current = iStack_d0._M_current + 1;
    }
  }
  local_a0 = this;
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)(local_d8 + 1))
  ;
  local_58.State = (cmState *)(pSVar3->BuildSystemDirectory).Tree;
  local_58.Position.Tree =
       (cmLinkedTree<cmState::SnapshotDataType> *)(pSVar3->BuildSystemDirectory).Position;
  local_38 = puVar1[2];
  local_58.Position.Position = *puVar1;
  pcStack_40 = (cmLinkedTree<cmState::SnapshotDataType> *)puVar1[1];
  pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)&local_58);
  std::__cxx11::string::string
            ((string *)&local_78,(pBVar4->Location)._M_dataplus._M_p,(allocator *)&local_98);
  pSVar5 = (Snapshot *)(local_d8 + 3);
  if (pSVar5 != iStack_d0._M_current) {
    do {
      pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&pSVar5->Position);
      local_58.State = (cmState *)(pSVar3->BuildSystemDirectory).Tree;
      local_58.Position.Tree =
           (cmLinkedTree<cmState::SnapshotDataType> *)(pSVar3->BuildSystemDirectory).Position;
      local_58.Position.Position = (PositionType)pSVar5->State;
      pcStack_40 = (pSVar5->Position).Tree;
      local_38 = (pSVar5->Position).Position;
      pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                         ((iterator *)&local_58);
      std::__cxx11::string::string
                ((string *)&local_98,(pBVar4->Location)._M_dataplus._M_p,&local_d9);
      bVar2 = cmsys::SystemTools::IsSubDirectory(&local_78,&local_98);
      if (bVar2) {
        std::__cxx11::string::_M_assign((string *)&local_78);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != iStack_d0._M_current);
  }
  pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&local_a0->DirectoryState);
  std::__cxx11::string::_M_assign((string *)&pBVar4->RelativePathTopSource);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != (undefined8 *)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  return;
}

Assistant:

void cmState::Directory::ComputeRelativePathTopSource()
{
  // Relative path conversion inside the source tree is not used to
  // construct relative paths passed to build tools so it is safe to use
  // even when the source is a network path.

  cmState::Snapshot snapshot = this->Snapshot_;
  std::vector<cmState::Snapshot> snapshots;
  snapshots.push_back(snapshot);
  while (true)
    {
    snapshot = snapshot.GetBuildsystemDirectoryParent();
    if (snapshot.IsValid())
      {
      snapshots.push_back(snapshot);
      }
    else
      {
      break;
      }
    }

  std::string result = snapshots.front().GetDirectory().GetCurrentSource();

  for (std::vector<cmState::Snapshot>::const_iterator it =
       snapshots.begin() + 1; it != snapshots.end(); ++it)
    {
    std::string currentSource = it->GetDirectory().GetCurrentSource();
    if(cmSystemTools::IsSubDirectory(result, currentSource))
      {
      result = currentSource;
      }
    }
  this->DirectoryState->RelativePathTopSource = result;
}